

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O3

string * __thiscall
MinVR::VRDatumStringArray::getValueString_abi_cxx11_
          (string *__return_storage_ptr__,VRDatumStringArray *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  _List_node_base *p_Var6;
  string out;
  key_type local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  p_Var2 = (this->
           super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
           ).super_VRDatum_conflict.attrList.
           super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"separator","");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(p_Var2 + 1),&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = (this->
           super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
           ).value.
           super__List_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = p_Var2[1]._M_next;
  local_58 = __return_storage_ptr__;
  if (p_Var6 != p_Var2[1]._M_prev) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_50,0,(char *)0x0,(ulong)p_Var6->_M_next);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_98.field_2._M_allocated_capacity = *psVar5;
        local_98.field_2._8_8_ = plVar4[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar5;
        local_98._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_98._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var6 = p_Var6 + 2;
    } while (p_Var6 != (this->
                       super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                       ).value.
                       super__List_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev);
  }
  psVar3 = local_58;
  std::__cxx11::string::substr((ulong)local_58,(ulong)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return psVar3;
}

Assistant:

std::string VRDatumStringArray::getValueString() const {
  std::string out;
  char separator;

  VRAttributeList::const_iterator it = attrList.front().find("separator");
  if (it == attrList.front().end()) {
    separator = MINVRSEPARATOR;
  } else {
    separator = static_cast<char>(it->second[0]);
  }

  for (VRStringArray::const_iterator it = value.front().begin();
       it != value.front().end(); ++it) {
    out += *it + std::string(1,separator);
  }

  // Remove trailing separator.
  return out.substr(0, out.size() - 1);
}